

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgen.c
# Opt level: O3

void qsub(char *qtag,int flags)

{
  byte bVar1;
  char cVar2;
  int qnum;
  int vnum;
  uint uVar3;
  char *pcVar4;
  FILE *__stream;
  char *pcVar5;
  ushort **ppuVar6;
  undefined8 extraout_RAX;
  char *__format;
  
  ::qnum = atoi(qtag);
  if (qsub::line == (char *)0x0) {
    pcVar4 = (char *)malloc(0x2000);
    qsub::line = pcVar4;
    qsub::qpath = (char *)malloc(0x2000);
    if (pcVar4 != (char *)0x0) {
      if (qsub::qpath == (char *)0x0) goto LAB_00104972;
      goto LAB_001045e3;
    }
  }
  else {
LAB_001045e3:
    pcVar4 = env_config("DSS_QUERY",".");
    sprintf(qsub::qpath,"%s%c%s.sql",pcVar4,0x2f,qtag);
    __stream = fopen64(qsub::qpath,"r");
    if (__stream != (FILE *)0x0) {
      rowcnt = rowcnt_dflt[::qnum];
      varsub(::qnum,0,flags);
      if (((uint)flags >> 0xe & 1) != 0) {
        fprintf(_stdout,"--#SET ROWS_FETCH %d\n",(ulong)(uint)rowcnt);
      }
      pcVar4 = fgets(qsub::line,0x2000,__stream);
      if (pcVar4 != (char *)0x0) {
        do {
          if (((uint)flags >> 0xb & 1) == 0) {
            strip_comments(qsub::line);
          }
          pcVar4 = qsub::line;
          pcVar5 = strchr(qsub::line,0x3a);
          if (pcVar5 != (char *)0x0) {
LAB_001046e6:
            *pcVar5 = '\0';
            fputs(pcVar4,_stdout);
            qnum = ::qnum;
            bVar1 = pcVar5[1];
            if (0x62 < bVar1) {
              switch(bVar1) {
              case 0x6e:
                goto switchD_00104716_caseD_4e;
              case 0x6f:
                goto switchD_00104716_caseD_4f;
              case 0x70:
              case 0x72:
              case 0x74:
              case 0x75:
              case 0x76:
              case 0x77:
                break;
              case 0x71:
                goto switchD_00104716_caseD_51;
              case 0x73:
                goto switchD_00104716_caseD_53;
              case 0x78:
                goto switchD_00104716_caseD_58;
              default:
                if (bVar1 == 99) goto switchD_00104716_caseD_43;
                if (bVar1 == 0x65) goto switchD_00104716_caseD_45;
              }
              goto switchD_00104716_caseD_3a;
            }
            switch(bVar1) {
            case 0x31:
            case 0x32:
            case 0x33:
            case 0x34:
            case 0x35:
            case 0x36:
            case 0x37:
            case 0x38:
            case 0x39:
              pcVar4 = pcVar5 + 1;
              vnum = atoi(pcVar4);
              varsub(qnum,vnum,flags & 1);
              ppuVar6 = __ctype_b_loc();
              do {
                pcVar5 = pcVar4 + 1;
                pcVar4 = pcVar4 + 1;
              } while ((*(byte *)((long)*ppuVar6 + (long)*pcVar5 * 2 + 1) & 8) != 0);
              goto LAB_001048db;
            case 0x3a:
            case 0x3b:
            case 0x3c:
            case 0x3d:
            case 0x3e:
            case 0x3f:
            case 0x40:
            case 0x41:
            case 0x44:
            case 0x46:
            case 0x47:
            case 0x48:
            case 0x49:
            case 0x4a:
            case 0x4b:
            case 0x4c:
            case 0x4d:
            case 0x50:
            case 0x52:
            case 0x54:
            case 0x55:
            case 0x56:
            case 0x57:
              goto switchD_00104716_caseD_3a;
            case 0x42:
switchD_00104716_caseD_42:
              if (((uint)flags >> 9 & 1) == 0) {
                __format = "%s\n";
                pcVar4 = "";
LAB_001048cd:
                fprintf(_stdout,__format,pcVar4);
              }
              break;
            case 0x43:
switchD_00104716_caseD_43:
              if ((flags & 8U) != 0) {
                __format = "CONNECT TO %s ;\n";
                pcVar4 = db_name;
                goto LAB_001048cd;
              }
              break;
            case 0x45:
switchD_00104716_caseD_45:
              if (((uint)flags >> 9 & 1) == 0) {
                __format = "%s\n";
                pcVar4 = "COMMIT WORK;";
                goto LAB_001048cd;
              }
              break;
            case 0x4e:
switchD_00104716_caseD_4e:
              if (((uint)flags >> 0xe & 1) == 0) {
                pcVar5 = pcVar5 + 2;
                uVar3 = atoi(pcVar5);
                rowcnt = uVar3;
                ppuVar6 = __ctype_b_loc();
                do {
                  do {
                    cVar2 = *pcVar5;
                    pcVar5 = pcVar5 + 1;
                  } while ((long)cVar2 == 0x20);
                } while (((*ppuVar6)[cVar2] & 0x800) != 0);
                fprintf(_stdout,"--#SET ROWS_FETCH %d\n",(ulong)uVar3);
              }
              goto LAB_001048db;
            case 0x4f:
switchD_00104716_caseD_4f:
              if ((flags & 2U) != 0) {
                uVar3 = snum;
                if (snum < 1) {
                  uVar3 = 0;
                }
                fprintf(_stdout,"%s \'%s/%s.%d\'","",osuff,qtag,(ulong)uVar3);
              }
              break;
            case 0x51:
switchD_00104716_caseD_51:
              fputs(qtag,_stdout);
              break;
            case 0x53:
switchD_00104716_caseD_53:
              uVar3 = snum;
              if (snum < 1) {
                uVar3 = 0;
              }
              fprintf(_stdout,"%d",(ulong)uVar3);
              break;
            case 0x58:
switchD_00104716_caseD_58:
              if ((flags & 4U) != 0) {
                __format = "%s\n";
                pcVar4 = "SET CURRENT EXPLAIN SNAPSHOT ON;";
                goto LAB_001048cd;
              }
              break;
            default:
              if (bVar1 == 0x62) goto switchD_00104716_caseD_42;
              goto switchD_00104716_caseD_3a;
            }
            goto LAB_001048d4;
          }
LAB_00104918:
          fputs(pcVar4,_stdout);
          pcVar4 = fgets(qsub::line,0x2000,__stream);
        } while (pcVar4 != (char *)0x0);
      }
      fclose(__stream);
      fflush(_stdout);
      return;
    }
    qsub_cold_1();
  }
  qsub_cold_3();
LAB_00104972:
  qsub_cold_2();
  printf("%s Parameter Substitution (v. %d.%d.%d%s)\n","SSB (Star Schema Benchmark)",1,0,0,"",
         extraout_RAX);
  printf("Copyright %s %s\n","Transaction Processing Performance Council","1994 - 2000");
  printf("USAGE: %s <options> [ queries ]\n",prog);
  puts("Options:");
  puts("\t-a\t\t-- use ANSI semantics.");
  puts("\t-b <str>\t-- load distributions from file <str> (default: dists.dss)");
  puts("\t-c\t\t-- retain comments found in template.");
  puts("\t-d\t\t-- use default substitution values.");
  puts("\t-h\t\t-- print this usage summary.");
  puts("\t-i <str>\t-- use the contents of file <str> to begin a query.");
  puts("\t-l <str>\t-- log parameters to <str>.");
  puts("\t-n <str>\t-- connect to database <str>.");
  puts("\t-N\t\t-- use default rowcounts and ignore :n directive.");
  puts("\t-o <str>\t-- set the output file base path to <str>.");
  puts("\t-p <n>\t\t-- use the query permutation for stream <n>");
  puts("\t-r <n>\t\t-- seed the random number generator with <n>");
  puts("\t-s <n>\t\t-- base substitutions on an SF of <n>");
  puts("\t-v\t\t-- verbose.");
  puts("\t-t <str>\t-- use the contents of file <str> to complete a query");
  puts("\t-x\t\t-- enable SET EXPLAIN in each query.");
  return;
switchD_00104716_caseD_3a:
  fprintf(_stderr,"-- unknown flag \'%c%c\' ignored\n",0x3a,(ulong)(uint)(int)(char)bVar1);
LAB_001048d4:
  pcVar4 = pcVar5 + 2;
LAB_001048db:
  pcVar5 = strchr(pcVar4,0x3a);
  if (pcVar5 == (char *)0x0) goto LAB_00104918;
  goto LAB_001046e6;
}

Assistant:

void
qsub(char *qtag, int flags)
{
static char *line = NULL,
    *qpath = NULL;
FILE *qfp;
char *cptr,
    *mark,
    *qroot = NULL;

    qnum = atoi(qtag);
    if (line == NULL)
        {
        line = malloc(BUFSIZ);
        qpath = malloc(BUFSIZ);
        MALLOC_CHECK(line);
        MALLOC_CHECK(qpath);
        }

    qroot = env_config(QDIR_TAG, QDIR_DFLT);
    sprintf(qpath, "%s%c%s.sql", 
		qroot, PATH_SEP, qtag);
    qfp = fopen(qpath, "r");
    OPEN_CHECK(qfp, qpath);

    rowcnt = rowcnt_dflt[qnum];
    varsub(qnum, 0, flags); /* set the variables */
    if (flags & DFLT_NUM)
        fprintf(ofp, SET_ROWCOUNT, rowcnt);
    while (fgets(line, BUFSIZ, qfp) != NULL)
        {
        if (!(flags & COMMENT))
            strip_comments(line);
        mark = line;
        while ((cptr = strchr(mark, VTAG)) != NULL)
            {
            *cptr = '\0';
             cptr++;
            fprintf(ofp,"%s", mark);
            switch(*cptr)
                {
                case 'b':
                case 'B':
                    if (!(flags & ANSI))
                        fprintf(ofp,"%s\n", START_TRAN);
                    cptr++;
                    break;
                case 'c':
                case 'C':
                    if (flags & DBASE)
                        fprintf(ofp, SET_DBASE, db_name);
                    cptr++;
                    break;
                case 'e':
                case 'E':
                    if (!(flags & ANSI))
                        fprintf(ofp,"%s\n", END_TRAN);
                    cptr++;
                    break;
                case 'n':
                case 'N':
                    if (!(flags & DFLT_NUM))
                        {
                        rowcnt=atoi(++cptr);
                        while (isdigit(*cptr) || *cptr == ' ') cptr++;
                        fprintf(ofp, SET_ROWCOUNT, rowcnt);
                        }
                    continue;
                case 'o':
                case 'O':
                    if (flags & OUTPUT)
                        fprintf(ofp,"%s '%s/%s.%d'", SET_OUTPUT, osuff, 
                            qtag, (snum < 0)?0:snum);
                    cptr++;
                    break;
                case 'q':
                case 'Q':
                    fprintf(ofp,"%s", qtag);
                    cptr++;
                    break;
                case 's':
                case 'S':
                    fprintf(ofp,"%d", (snum < 0)?0:snum);
                    cptr++;
                    break;
                case 'X':
                case 'x':
                    if (flags & EXPLAIN)
                        fprintf(ofp, "%s\n", GEN_QUERY_PLAN);
                    cptr++;
                    break;
		case '1':
		case '2':
		case '3':
		case '4':
		case '5':
		case '6':
		case '7':
		case '8':
		case '9':
                    varsub(qnum, atoi(cptr), flags & DFLT);
                    while (isdigit(*++cptr));
                    break;
                default:
		    fprintf(stderr, "-- unknown flag '%c%c' ignored\n", 
                        VTAG, *cptr);
		    cptr++;
		    break;
                }
            mark=cptr;
            }
        fprintf(ofp,"%s", mark);
        }
    fclose(qfp);
    fflush(stdout);
    return;
}